

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O2

void __thiscall
ncnn::MultiHeadAttention_x86_avx512::MultiHeadAttention_x86_avx512
          (MultiHeadAttention_x86_avx512 *this)

{
  MultiHeadAttention::MultiHeadAttention((MultiHeadAttention *)&this->field_0x40);
  this->_vptr_MultiHeadAttention_x86_avx512 = (_func_int **)0x58cec0;
  *(undefined8 *)&this->field_0x40 = 0x58cf40;
  this->field_0x4b = 1;
  this->q_gemm = (Layer *)0x0;
  this->k_gemm = (Layer *)0x0;
  this->v_gemm = (Layer *)0x0;
  this->o_gemm = (Layer *)0x0;
  this->o_gemm = (Layer *)0x0;
  this->qk_gemm = (Layer *)0x0;
  this->qkv_gemm = (Layer *)0x0;
  this->qk_softmax = (Layer *)0x0;
  return;
}

Assistant:

MultiHeadAttention_x86_avx512::MultiHeadAttention_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    q_gemm = 0;
    k_gemm = 0;
    v_gemm = 0;

    qk_gemm = 0;
    qkv_gemm = 0;

    qk_softmax = 0;

    o_gemm = 0;
}